

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O2

void __thiscall glu::TextureCube::upload(TextureCube *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TransferFormat TVar5;
  long lVar6;
  TestError *this_00;
  int levelNdx;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ConstPixelBufferAccess access;
  long lVar4;
  
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (this->m_glTexture != 0) {
    (**(code **)(lVar4 + 0xb8))(0x8513);
    pcVar1 = *(code **)(lVar4 + 0xff0);
    iVar2 = computePixelStore(&(this->m_refTexture).m_format);
    (*pcVar1)(0xcf5,iVar2);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    checkError(dVar3,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x185);
    TVar5 = getTransferFormat((this->m_refTexture).m_format);
    for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
      lVar9 = 8;
      lVar8 = 0;
      uVar7 = 0;
      while( true ) {
        if ((long)(int)(((long)(this->m_refTexture).m_access[0].
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_refTexture).m_access[0].
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= (long)uVar7)
        break;
        if (*(long *)((long)&((this->m_refTexture).m_data[lVar6].
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9) != 0) {
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    (&access,(ConstPixelBufferAccess *)
                             ((long)(((this->m_refTexture).m_access[lVar6].
                                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_ConstPixelBufferAccess).m_size.m_data + lVar8 + -8));
          pcVar1 = *(code **)(lVar4 + 0x1310);
          dVar3 = getGLCubeFace((CubeFace)lVar6);
          (*pcVar1)(dVar3,uVar7 & 0xffffffff,this->m_format,access.m_size.m_data[0],
                    access.m_size.m_data[1],0,TVar5,(ulong)TVar5 >> 0x20,access.m_data);
        }
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x28;
        lVar9 = lVar9 + 0x10;
      }
    }
    dVar3 = (**(code **)(lVar4 + 0x800))();
    checkError(dVar3,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x196);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x182);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCube::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	DE_ASSERT(!m_isCompressed);

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
		{
			if (m_refTexture.isLevelEmpty((tcu::CubeFace)face, levelNdx))
				continue; // Don't upload.

			tcu::ConstPixelBufferAccess access = m_refTexture.getLevelFace(levelNdx, (tcu::CubeFace)face);
			DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*access.getWidth());
			gl.texImage2D(getGLCubeFace((tcu::CubeFace)face), levelNdx, m_format, access.getWidth(), access.getHeight(), 0 /* border */, transferFormat.format, transferFormat.dataType, access.getDataPtr());
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}